

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O2

Array<capnp::word> * __thiscall
capnp::messageToFlatArray
          (Array<capnp::word> *__return_storage_ptr__,capnp *this,
          ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments)

{
  uint uVar1;
  size_t count;
  word *pwVar2;
  void *__dest;
  long lVar3;
  ArrayPtr<const_capnp::word> *__begin1;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  Array<capnp::word> local_48;
  
  segments_00.size_ = segments.ptr;
  segments_00.ptr = segments_00.size_;
  count = computeSerializedSizeInWords(this,segments_00);
  pwVar2 = kj::_::HeapArrayDisposer::allocate<capnp::word>(count);
  local_48.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  *(int *)&pwVar2->content = (int)segments.ptr + -1;
  for (uVar1 = 1; (ArrayPtr<const_capnp::word> *)(ulong)(uVar1 - 1) < segments_00.size_;
      uVar1 = uVar1 + 1) {
    *(undefined4 *)((long)&pwVar2->content + (ulong)uVar1 * 4) =
         *(undefined4 *)(this + (long)(ulong)(uVar1 - 1) * 0x10 + 8);
  }
  if (((undefined1  [16])segments & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    *(undefined4 *)((long)&pwVar2->content + (long)segments_00.size_ * 4 + 4) = 0;
  }
  __dest = (void *)((long)&pwVar2[1].content + ((ulong)segments_00.size_ & 0xfffffffffffffffe) * 4);
  for (lVar3 = (long)segments_00.size_ << 4; lVar3 != 0; lVar3 = lVar3 + -0x10) {
    memcpy(__dest,*(void **)this,*(long *)(this + 8) << 3);
    __dest = (void *)((long)__dest + *(long *)(this + 8) * 8);
    this = this + 0x10;
  }
  __return_storage_ptr__->ptr = pwVar2;
  __return_storage_ptr__->size_ = count;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_48.ptr = (word *)0x0;
  local_48.size_ = 0;
  kj::Array<capnp::word>::~Array(&local_48);
  return __return_storage_ptr__;
}

Assistant:

kj::Array<word> messageToFlatArray(kj::ArrayPtr<const kj::ArrayPtr<const word>> segments) {
  kj::Array<word> result = kj::heapArray<word>(computeSerializedSizeInWords(segments));

  _::WireValue<uint32_t>* table =
      reinterpret_cast<_::WireValue<uint32_t>*>(result.begin());

  // We write the segment count - 1 because this makes the first word zero for single-segment
  // messages, improving compression.  We don't bother doing this with segment sizes because
  // one-word segments are rare anyway.
  table[0].set(segments.size() - 1);

  for (uint i = 0; i < segments.size(); i++) {
    table[i + 1].set(segments[i].size());
  }

  if (segments.size() % 2 == 0) {
    // Set padding byte.
    table[segments.size() + 1].set(0);
  }

  word* dst = result.begin() + segments.size() / 2 + 1;

  for (auto& segment: segments) {
    memcpy(dst, segment.begin(), segment.size() * sizeof(word));
    dst += segment.size();
  }

  KJ_DASSERT(dst == result.end(), "Buffer overrun/underrun bug in code above.");

  return kj::mv(result);
}